

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestOneofParsingLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint32_t uVar1;
  uint32_t uVar2;
  TestOneofParsingLite *pTVar3;
  Nullable<const_char_*> failure_msg;
  string *value;
  TestAllTypesLite *pTVar4;
  Arena *arena;
  TestOneofParsingLite *_this;
  TestOneofParsingLite *local_40;
  LogMessageFatal local_38;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_40 = (TestOneofParsingLite *)to_msg;
  local_38.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestOneofParsingLite_const*,proto2_unittest::TestOneofParsingLite*>
                          ((TestOneofParsingLite **)&local_38,&local_40,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
               ,0x2d3a,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
  }
  uVar1 = *(uint32_t *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4);
  if (uVar1 == 0) goto switchD_0018dc6a_default;
  uVar2 = (local_40->field_0)._impl_._oneof_case_[0];
  if (uVar2 != uVar1) {
    if (uVar2 != 0) {
      clear_oneof_field(local_40);
    }
    (local_40->field_0)._impl_._oneof_case_[0] = uVar1;
  }
  pTVar3 = local_40;
  switch(uVar1) {
  case 1:
  case 9:
    *(undefined4 *)&local_40->field_0 = *(undefined4 *)&from_msg[1]._vptr_MessageLite;
    goto switchD_0018dc6a_default;
  case 2:
    if (uVar2 == uVar1) {
      TestAllTypesLite::MergeImpl
                (&((local_40->field_0)._impl_.oneof_field_.oneof_submessage_)->super_MessageLite,
                 (MessageLite *)from_msg[1]._vptr_MessageLite);
    }
    else {
      pTVar4 = (TestAllTypesLite *)
               google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                         (arena,from_msg[1]._vptr_MessageLite);
      (local_40->field_0)._impl_.oneof_field_.oneof_submessage_ = pTVar4;
    }
    goto switchD_0018dc6a_default;
  case 3:
    if (uVar2 != uVar1) {
      (local_40->field_0)._impl_.oneof_field_.oneof_submessage_ =
           (TestAllTypesLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4) == 3) goto LAB_0018dd1e;
LAB_0018dcfb:
    value = (string *)&google::protobuf::internal::fixed_address_empty_string;
    break;
  case 4:
    if (uVar2 != uVar1) {
      (local_40->field_0)._impl_.oneof_field_.oneof_submessage_ =
           (TestAllTypesLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    value = _internal_oneof_bytes_abi_cxx11_((TestOneofParsingLite *)from_msg);
    break;
  case 5:
    if (uVar2 != uVar1) {
      (local_40->field_0)._impl_.oneof_field_.oneof_submessage_ =
           (TestAllTypesLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    value = _internal_oneof_string_cord_abi_cxx11_((TestOneofParsingLite *)from_msg);
    break;
  case 6:
    if (uVar2 == uVar1) {
      pTVar4 = (local_40->field_0)._impl_.oneof_field_.oneof_submessage_;
    }
    else {
      pTVar4 = (TestAllTypesLite *)google::protobuf::Arena::Create<absl::lts_20250127::Cord>(arena);
      *(TestAllTypesLite **)&local_40->field_0 = pTVar4;
    }
    absl::lts_20250127::Cord::InlineRep::operator=
              ((InlineRep *)pTVar4,(InlineRep *)from_msg[1]._vptr_MessageLite);
    goto switchD_0018dc6a_default;
  case 7:
    if (uVar2 != uVar1) {
      (local_40->field_0)._impl_.oneof_field_.oneof_submessage_ =
           (TestAllTypesLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)((long)&from_msg[1]._internal_metadata_.ptr_ + 4) != 7) goto LAB_0018dcfb;
LAB_0018dd1e:
    value = (string *)((ulong)from_msg[1]._vptr_MessageLite & 0xfffffffffffffffc);
    break;
  case 8:
    if (uVar2 != uVar1) {
      (local_40->field_0)._impl_.oneof_field_.oneof_submessage_ =
           (TestAllTypesLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    value = _internal_oneof_bytes_string_piece_abi_cxx11_((TestOneofParsingLite *)from_msg);
    break;
  default:
    goto switchD_0018dc6a_default;
  }
  google::protobuf::internal::ArenaStringPtr::Set<>
            ((ArenaStringPtr *)&(pTVar3->field_0)._impl_,value,arena);
switchD_0018dc6a_default:
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(local_40->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestOneofParsingLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestOneofParsingLite*>(&to_msg);
  auto& from = static_cast<const TestOneofParsingLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestOneofParsingLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofInt32: {
        _this->_impl_.oneof_field_.oneof_int32_ = from._impl_.oneof_field_.oneof_int32_;
        break;
      }
      case kOneofSubmessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_submessage_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_submessage_);
        } else {
          _this->_impl_.oneof_field_.oneof_submessage_->MergeFrom(*from._impl_.oneof_field_.oneof_submessage_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofStringCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_cord_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_cord_.Set(from._internal_oneof_string_cord(), arena);
        break;
      }
      case kOneofBytesCord: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_cord_ = ::google::protobuf::Arena::Create<absl::Cord>(arena);
        }
        *_this->_impl_.oneof_field_.oneof_bytes_cord_ = *from._impl_.oneof_field_.oneof_bytes_cord_;
        break;
      }
      case kOneofStringStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_string_piece_.Set(from._internal_oneof_string_string_piece(), arena);
        break;
      }
      case kOneofBytesStringPiece: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_string_piece_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_string_piece_.Set(from._internal_oneof_bytes_string_piece(), arena);
        break;
      }
      case kOneofEnum: {
        _this->_impl_.oneof_field_.oneof_enum_ = from._impl_.oneof_field_.oneof_enum_;
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}